

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void rewindPaths(int previousDecisionLevel,int newDecisionLevel,RewindStyle rewindStyle,long param_4
                )

{
  NodeUID parent_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int myalt;
  int parent;
  int nodeid;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffec4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  value_type vVar6;
  undefined4 in_stack_fffffffffffffee0;
  value_type vVar7;
  undefined4 in_stack_fffffffffffffee4;
  uint in_stack_ffffffffffffff14;
  int32_t in_stack_ffffffffffffff30;
  NodeUID in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  NodeStatus in_stack_ffffffffffffff70;
  
  if (in_EDX == 0) {
    std::vector<int,_std::allocator<int>_>::operator[](&decisionLevelTip,(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::vector<int,_std::allocator<int>_>::operator[](&decisionLevelTip,(long)in_ESI);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  else {
    if (in_EDX != 1) {
      abort();
    }
    std::vector<int,_std::allocator<int>_>::operator[](&decisionLevelTip,(long)(in_EDI + -1));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::vector<int,_std::allocator<int>_>::operator[](&decisionLevelTip,(long)(in_EDI + -1));
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    while( true ) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&nodepath);
      iVar2 = (int)sVar3;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&decisionLevelTip,(long)in_ESI);
      if (iVar2 <= *pvVar4) break;
      nextnodeid = nextnodeid + 1;
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffed0);
      if (bVar1) {
        vVar7 = -1;
      }
      else {
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&nodepath);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&nodepath,sVar3 - 1);
        vVar7 = *pvVar4;
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffed0);
      if (bVar1) {
        vVar6 = -1;
      }
      else {
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&altpath);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&altpath,sVar3 - 1);
        vVar6 = *pvVar4;
      }
      bVar1 = doProfiling();
      if (bVar1) {
        uVar5 = 0;
        in_stack_fffffffffffffed0 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff30;
        parent_00.rid = 0;
        parent_00.nid = engine.restart_count;
        parent_00.tid = in_stack_ffffffffffffff30;
        cpprofiler::Connector::createNode
                  ((Connector *)((ulong)in_stack_ffffffffffffff14 << 0x20),in_stack_ffffffffffffff44
                   ,parent_00,in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff70);
        sendNode<cpprofiler::Node>((Node *)0x280389);
        cpprofiler::Node::~Node((Node *)CONCAT44(in_stack_fffffffffffffec4,uVar5));
      }
      std::vector<int,_std::allocator<int>_>::size(&nodepath);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,vVar7),
                 CONCAT44(vVar6,in_stack_fffffffffffffed8));
      std::vector<int,_std::allocator<int>_>::size(&altpath);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,vVar7),
                 CONCAT44(vVar6,in_stack_fffffffffffffed8));
    }
  }
  return;
}

Assistant:

void rewindPaths(int previousDecisionLevel, int newDecisionLevel, RewindStyle rewindStyle,
								 long /*timestamp*/) {
	switch (rewindStyle) {
		case REWIND_OMIT_SKIPPED:
			nodepath.resize(decisionLevelTip[newDecisionLevel]);
			altpath.resize(decisionLevelTip[newDecisionLevel] - 1);
			break;
		case REWIND_SEND_SKIPPED:
#if DEBUG_VERBOSE
			std::cerr << "rewinding to level " << newDecisionLevel << "\n";
			std::cerr << "before, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "     and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif

			// The tip of the nodepath and altpath lead us to the node
			// that failed.  (That is, the last element of nodepath is the
			// id of the node that failed.)  We first unwind that tip to
			// the next decision level, so that we don't send a "skipped
			// child" for that node or any others at this level.
			nodepath.resize(decisionLevelTip[previousDecisionLevel - 1]);
			altpath.resize(decisionLevelTip[previousDecisionLevel - 1] - 1);

			// Now walk back through the decision levels, sending a
			// "skipped" node for each child that was never visited.
			while (static_cast<int>(nodepath.size()) > decisionLevelTip[newDecisionLevel]) {
				const int nodeid = nextnodeid;
				nextnodeid++;
				const int parent = (nodepath.empty()) ? (-1) : (nodepath[nodepath.size() - 1]);
				int myalt = (altpath.empty()) ? (-1) : (altpath[altpath.size() - 1]);

				// myalt is the alternative that led to the failure; the
				// skipped node is conceptually the next alternative.
				myalt++;

#ifdef HAS_PROFILER
				if (doProfiling()) {
					sendNode(profilerConnector->createNode({nodeid, engine.restart_count, 0}, {parent, 0, 0},
																								 myalt, 0, cpprofiler::NodeStatus::SKIPPED));
					//    .set_decision_level(currentDecisionLevel)
					//    .set_time(timestamp));
				}
#endif
				nodepath.resize(nodepath.size() - 1);
				altpath.resize(altpath.size() - 1);
			}
#if DEBUG_VERBOSE
			std::cerr << "after, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "    and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif
			break;
		default:
			std::abort();
	}
}